

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * llvm::outs(void)

{
  error_code EC;
  int local_10 [2];
  undefined8 local_8;
  
  local_10[0] = 0;
  local_8 = std::_V2::system_category();
  if (outs()::S == '\0') {
    outs((llvm *)local_10);
  }
  if (local_10[0] == 0) {
    return (raw_ostream *)&outs::S;
  }
  __assert_fail("!EC",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x30c,"raw_ostream &llvm::outs()");
}

Assistant:

raw_ostream &llvm::outs() {
  // Set buffer settings to model stdout behavior.
  std::error_code EC;
  static raw_fd_ostream S("-", EC, sys::fs::F_None);
  assert(!EC);
  return S;
}